

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfHeader.cpp
# Opt level: O1

void __thiscall Imf_3_4::Header::readFrom(Header *this,IStream *is,int *version)

{
  ostream *poVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  iterator iVar6;
  char *__s1;
  OpaqueAttribute *this_00;
  mapped_type *ppAVar7;
  size_t sVar8;
  InputExc *pIVar9;
  uint uVar10;
  long lVar11;
  char b [4];
  char name [256];
  char typeName [256];
  char *in_stack_fffffffffffffc18;
  key_type local_3c0;
  char local_238 [256];
  char local_138 [264];
  
  iVar5 = 0;
  do {
    lVar11 = 0;
    do {
      (*is->_vptr_IStream[3])(is,local_238 + lVar11,1);
      cVar2 = local_238[0];
      if (local_238[lVar11] == '\0') break;
      iVar4 = (int)lVar11;
      lVar11 = lVar11 + 1;
    } while (iVar4 != 0xff);
    if (local_238[0] == '\0') {
      if (iVar5 == 0) {
        this->_readsNothing = true;
      }
      else {
        this->_readsNothing = false;
      }
    }
    else {
      (anonymous_namespace)::checkIsNullTerminated<256ul>(&local_238,"attribute name");
      lVar11 = 0;
      do {
        (*is->_vptr_IStream[3])(is,local_138 + lVar11,1);
        if (local_138[lVar11] == '\0') break;
        iVar4 = (int)lVar11;
        lVar11 = lVar11 + 1;
      } while (iVar4 != 0xff);
      (anonymous_namespace)::checkIsNullTerminated<256ul>
                ((char (*) [256])local_138,"attribute type name");
      (*is->_vptr_IStream[3])(is,&local_3c0,4);
      if ((int)((uint)(byte)local_3c0._text[3] << 0x18) < 0) {
        pIVar9 = (InputExc *)__cxa_allocate_exception(0x48);
        Iex_3_4::InputExc::InputExc(pIVar9,"Invalid size field in header attribute");
        __cxa_throw(pIVar9,&Iex_3_4::InputExc::typeinfo,Iex_3_4::InputExc::~InputExc);
      }
      uVar10 = CONCAT13(local_3c0._text[3],local_3c0._text._0_3_);
      strncpy(local_3c0._text,local_238,0xff);
      local_3c0._text[0xff] = '\0';
      iVar6 = std::
              _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Attribute_*>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Attribute_*>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Attribute_*>_>_>
              ::find((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Attribute_*>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Attribute_*>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Attribute_*>_>_>
                      *)this,&local_3c0);
      if ((_Rb_tree_header *)iVar6._M_node == &(this->_map)._M_t._M_impl.super__Rb_tree_header) {
        bVar3 = Attribute::knownType(in_stack_fffffffffffffc18);
        if (bVar3) {
          this_00 = (OpaqueAttribute *)Attribute::newAttribute(in_stack_fffffffffffffc18);
        }
        else {
          this_00 = (OpaqueAttribute *)operator_new(0x40);
          OpaqueAttribute::OpaqueAttribute(this_00,local_138);
        }
        (*(this_00->super_Attribute)._vptr_Attribute[5])
                  (this_00,is,(ulong)uVar10,(ulong)(uint)*version);
        strncpy(local_3c0._text,local_238,0xff);
        local_3c0._text[0xff] = '\0';
        ppAVar7 = std::
                  map<Imf_3_4::Name,_Imf_3_4::Attribute_*,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Attribute_*>_>_>
                  ::operator[](&this->_map,&local_3c0);
        *ppAVar7 = &this_00->super_Attribute;
      }
      else {
        __s1 = (char *)(**(code **)(**(long **)(iVar6._M_node + 9) + 0x10))();
        iVar4 = strncmp(__s1,local_138,0x100);
        if (iVar4 != 0) {
          iex_debugTrap();
          std::__cxx11::stringstream::stringstream((stringstream *)&local_3c0);
          poVar1 = (ostream *)(local_3c0._text + 0x10);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar1,"Unexpected type for image attribute \"",0x25);
          sVar8 = strlen(local_238);
          std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_238,sVar8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\".",2);
          pIVar9 = (InputExc *)__cxa_allocate_exception(0x48);
          Iex_3_4::InputExc::InputExc(pIVar9,(stringstream *)&local_3c0);
          __cxa_throw(pIVar9,&Iex_3_4::InputExc::typeinfo,Iex_3_4::InputExc::~InputExc);
        }
        (**(code **)(**(long **)(iVar6._M_node + 9) + 0x28))
                  (*(long **)(iVar6._M_node + 9),is,uVar10,*version);
      }
      iVar5 = iVar5 + 1;
    }
    if (cVar2 == '\0') {
      return;
    }
  } while( true );
}

Assistant:

void
Header::readFrom (OPENEXR_IMF_INTERNAL_NAMESPACE::IStream& is, int& version)
{
    //
    // Read all attributes.
    //

    int attrCount = 0;

    while (true)
    {
        //
        // Read the name of the attribute.
        // A zero-length attribute name indicates the end of the header.
        //

        char name[Name::SIZE];
        OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::read<
            OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (
            is, Name::MAX_LENGTH, name);

        if (name[0] == 0)
        {
            if (attrCount == 0)
                _readsNothing = true;
            else
                _readsNothing = false;
            break;
        }

        attrCount++;

        checkIsNullTerminated (name, "attribute name");

        //
        // Read the attribute type and the size of the attribute value.
        //

        char typeName[Name::SIZE];
        int  size;

        OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::read<
            OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (
            is, Name::MAX_LENGTH, typeName);
        checkIsNullTerminated (typeName, "attribute type name");
        OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::read<
            OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (is, size);

        if (size < 0)
        {
            throw IEX_NAMESPACE::InputExc (
                "Invalid size field in header attribute");
        }

        AttributeMap::iterator i = _map.find (name);

        if (i != _map.end ())
        {
            //
            // The attribute already exists (for example,
            // because it is a predefined attribute).
            // Read the attribute's new value from the file.
            //

            if (strncmp (i->second->typeName (), typeName, sizeof (typeName)))
                THROW (
                    IEX_NAMESPACE::InputExc,
                    "Unexpected type for image attribute "
                    "\"" << name
                         << "\".");

            i->second->readValueFrom (is, size, version);
        }
        else
        {
            //
            // The new attribute does not exist yet.
            // If the attribute type is of a known type,
            // read the attribute value.  If the attribute
            // is of an unknown type, read its value and
            // store it as an OpaqueAttribute.
            //

            Attribute* attr;

            if (Attribute::knownType (typeName))
                attr = Attribute::newAttribute (typeName);
            else
                attr = new OpaqueAttribute (typeName);

            try
            {
                attr->readValueFrom (is, size, version);
                _map[name] = attr;
            }
            catch (...)
            {
                delete attr;
                throw;
            }
        }
    }
}